

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O1

void predict_or_learn<true>(boosting *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  pointer pvVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float local_58;
  
  fVar2 = ec->weight;
  o->t = o->t + 1;
  uVar10 = (ulong)(uint)o->N;
  local_58 = 0.0;
  if (0 < o->N) {
    lVar13 = 0;
    local_58 = 0.0;
    fVar17 = 0.0;
    do {
      iVar14 = (int)lVar13;
      fVar16 = floorf(((float)((int)uVar10 - iVar14) - fVar17) * 0.5);
      lVar13 = lVar13 + 1;
      uVar9 = (int)uVar10 - (int)lVar13;
      if (((int)uVar9 < 0) || ((float)(int)uVar9 < fVar16)) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        if (0.0 <= fVar16) {
          uVar10 = (ulong)uVar9;
          pvVar3 = (o->C).
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = (ulong)fVar16;
          if (*(long *)(*(long *)&pvVar3[uVar10].super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data + uVar11 * 8) == -1) {
            if (uVar10 < uVar11) {
              lVar6 = 0;
            }
            else {
              lVar6 = 1;
              if (0 < (long)uVar11 && uVar11 != uVar10) {
                uVar8 = uVar10;
                uVar12 = 1;
                do {
                  lVar6 = lVar6 * uVar8;
                  uVar8 = uVar8 - 1;
                  lVar6 = lVar6 / (long)uVar12;
                  bVar15 = uVar12 != uVar11;
                  uVar12 = uVar12 + 1;
                } while (bVar15);
              }
            }
            *(long *)(*(long *)&pvVar3[uVar10].super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data + uVar11 * 8) = lVar6;
          }
          else {
            lVar6 = *(long *)(*(long *)&pvVar3[uVar10].
                                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                        super__Vector_impl_data + uVar11 * 8);
          }
        }
      }
      dVar4 = pow((double)o->gamma + 0.5,(double)fVar16);
      dVar5 = pow(0.5 - (double)o->gamma,(double)((float)(o->N - (int)lVar13) - fVar16));
      ec->weight = (float)dVar5 * (float)dVar4 * (float)lVar6 * fVar2;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar14);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar7 = (ec->super_example_predict).ft_offset - (ulong)(uint)(*(int *)(base + 0xe0) * iVar14);
      (ec->super_example_predict).ft_offset = uVar7;
      fVar17 = fVar17 + (ec->l).simple.label * (ec->pred).scalar;
      local_58 = local_58 + (ec->pred).scalar;
      (ec->super_example_predict).ft_offset = (uint)(*(int *)(base + 0xe0) * iVar14) + uVar7;
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(iVar14 * *(int *)(base + 0xe0));
      uVar10 = (ulong)o->N;
    } while (lVar13 < (long)uVar10);
  }
  ec->weight = fVar2;
  ec->partial_prediction = local_58;
  fVar17 = *(float *)(&DAT_002759f8 + (ulong)(0.0 < local_58) * 4);
  (ec->pred).scalar = fVar17;
  ec->loss = (float)(~-(uint)(fVar17 == (ec->l).simple.label) & (uint)fVar2);
  return;
}

Assistant:

void predict_or_learn(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float k = floorf((float)(o.N - i - s) / 2);
      int64_t c;
      if (o.N - (i + 1) < 0)
        c = 0;
      else if (k > o.N - (i + 1))
        c = 0;
      else if (k < 0)
        c = 0;
      else if (o.C[o.N - (i + 1)][(int64_t)k] != -1)
        c = o.C[o.N - (i + 1)][(int64_t)k];
      else
      {
        c = choose(o.N - (i + 1), (int64_t)k);
        o.C[o.N - (i + 1)][(int64_t)k] = c;
      }

      float w = c * (float)pow((double)(0.5 + o.gamma), (double)k) *
          (float)pow((double)0.5 - o.gamma, (double)(o.N - (i + 1) - k));

      // update ec.weight, weight for learner i (starting from 0)
      ec.weight = u * w;

      base.predict(ec, i);

      // ec.pred.scalar is now the i-th learner prediction on this example
      s += ld.label * ec.pred.scalar;

      final_prediction += ec.pred.scalar;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}